

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O0

void __thiscall glslang::TBuiltInParseables::TBuiltInParseables(TBuiltInParseables *this)

{
  TBuiltInParseables *local_18;
  TBuiltInParseables *this_local;
  
  this->_vptr_TBuiltInParseables = (_func_int **)&PTR__TBuiltInParseables_010de060;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string(&this->commonBuiltins);
  local_18 = (TBuiltInParseables *)this->stageBuiltins;
  do {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 local_18);
    local_18 = (TBuiltInParseables *)((local_18->commonBuiltins).field_2._M_local_buf + 8);
  } while (local_18 != this + 1);
  return;
}

Assistant:

TBuiltInParseables::TBuiltInParseables()
{
}